

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerTest.cpp
# Opt level: O1

void __thiscall TestClass::ProcessFunc3(TestClass *this,Event3 *ev)

{
  timeval curTime;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  return;
}

Assistant:

void TestClass::ProcessFunc3( Event3 *ev )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	struct timeval curTime;
	TimeUtils::getCurTime( &curTime );
	
	int elapsed = TimeUtils::getDifference( &curTime, &ev->mSent );
	LOG_NOTICE( "Timer %p with tick time %d, elapsed is %d\n",
				ev->mTimer, ev->mTimer->getTickTime(), elapsed );
}